

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O2

void kv_set_str_key_test(btree_kv_ops *kv_ops)

{
  __suseconds_t *__s;
  _func_void_btree_ptr_void_ptr_void_ptr *p_Var1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  void *__s1;
  char *__format;
  undefined8 uStack_80;
  btree local_78;
  undefined1 local_40 [8];
  timeval __test_begin;
  char src [7];
  
  uStack_80 = 0x1024df;
  gettimeofday((timeval *)local_40,(__timezone_ptr_t)0x0);
  uStack_80 = 0x1024e4;
  memleak_start();
  __s = &__test_begin.tv_usec;
  __test_begin.tv_usec._4_3_ = 0x7965;
  __test_begin.tv_usec._0_4_ = 0x6b637273;
  uStack_80 = 0x1024ff;
  sVar4 = strlen((char *)__s);
  lVar2 = -(sVar4 + 0xf & 0xfffffffffffffff0);
  __s1 = (void *)((long)&local_78 + lVar2);
  local_78.ksize = (uint8_t)sVar4;
  p_Var1 = kv_ops->set_key;
  *(undefined8 *)((long)&uStack_80 + lVar2) = 0x102525;
  (*p_Var1)(&local_78,__s1,__s);
  uVar5 = (ulong)local_78.ksize;
  *(undefined8 *)((long)&uStack_80 + lVar2) = 0x102535;
  iVar3 = bcmp(__s1,__s,uVar5);
  if (iVar3 != 0) {
    *(undefined8 *)((long)&uStack_80 + lVar2) = 0x10255d;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x1ad);
    kv_set_str_key_test(btree_kv_ops*)::__test_pass = '\x01';
    uVar5 = (ulong)local_78.ksize;
    *(undefined8 *)((long)&uStack_80 + lVar2) = 0x102574;
    iVar3 = bcmp(__s1,&__test_begin.tv_usec,uVar5);
    if (iVar3 != 0) {
      *(code **)((long)&uStack_80 + lVar2) = kv_set_str_value_test;
      __assert_fail("!memcmp(dst, src, tree->ksize)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x1ad,"void kv_set_str_key_test(btree_kv_ops *)");
    }
  }
  *(undefined8 *)((long)&uStack_80 + lVar2) = 0x10257d;
  memleak_end();
  __format = "%s PASSED\n";
  if (kv_set_str_key_test(btree_kv_ops*)::__test_pass != '\0') {
    __format = "%s FAILED\n";
  }
  *(undefined8 *)((long)&uStack_80 + lVar2) = 0x1025ae;
  fprintf(_stderr,__format,"kv_set_str_key_test");
  return;
}

Assistant:

void kv_set_str_key_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    btree *tree = alca(struct btree, 1);
    char src[] = "srckey";
    char *dst = alca(char, strlen(src));
    tree->ksize = strlen(src);
    kv_ops->set_key(tree, dst, src);
    TEST_CHK(!memcmp(dst, src, tree->ksize));

    memleak_end();
    TEST_RESULT("kv_set_str_key_test");
}